

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O0

void charls::transform_line<charls::transform_hp2<unsigned_short>::inverse,unsigned_short>
               (triplet<unsigned_short> *destination,triplet<unsigned_short> *source,
               size_t pixel_count,inverse *transform)

{
  triplet<unsigned_short> tVar1;
  triplet<unsigned_short> *ptVar2;
  ulong local_30;
  size_t i;
  inverse *transform_local;
  size_t pixel_count_local;
  triplet<unsigned_short> *source_local;
  triplet<unsigned_short> *destination_local;
  
  for (local_30 = 0; local_30 < pixel_count; local_30 = local_30 + 1) {
    tVar1 = transform_hp2<unsigned_short>::inverse::operator()
                      (transform,(uint)source[local_30].field_0.v1,(uint)source[local_30].field_1.v2
                       ,(uint)source[local_30].field_2.v3);
    ptVar2 = destination + local_30;
    ptVar2->field_0 = (anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1)(short)tVar1._0_4_;
    ptVar2->field_1 =
         (anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3)(short)((uint)tVar1._0_4_ >> 0x10);
    (ptVar2->field_2).v3 = (unsigned_short)tVar1.field_2;
  }
  return;
}

Assistant:

void transform_line(triplet<PixelType>* destination, const triplet<PixelType>* source, const size_t pixel_count,
                    Transform& transform) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] = transform(source[i].v1, source[i].v2, source[i].v3);
    }
}